

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argengine.cpp
# Opt level: O0

shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> __thiscall
juzzlin::Argengine::Impl::addOption
          (Impl *this,OptionSet *optionVariants,ValuelessCallback *callback,bool required,
          string *infoText)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> sVar1;
  string *in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffb7;
  function<void_()> *in_stack_ffffffffffffffb8;
  OptionSet *in_stack_ffffffffffffffc0;
  Impl *in_stack_ffffffffffffffc8;
  
  std::function<void_()>::function((function<void_()> *)in_RDI,(function<void_()> *)in_RDI);
  addOptionCommon<std::function<void()>>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (bool)in_stack_ffffffffffffffb7,in_stack_ffffffffffffffa8);
  std::function<void_()>::~function((function<void_()> *)0x12a1e9);
  sVar1.super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>)
         sVar1.
         super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<OptionDefinition> addOption(const OptionSet & optionVariants, ValuelessCallback callback, bool required, const std::string & infoText)
    {
        return addOptionCommon(optionVariants, callback, required, infoText);
    }